

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurseSolution.cpp
# Opt level: O3

bool __thiscall NurseSolution::addTurn(NurseSolution *this,Turn *turn)

{
  pointer *pppTVar1;
  iterator __position;
  __normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_> _Var2;
  Turn *local_30;
  Turn *local_28;
  
  local_30 = turn;
  local_28 = turn;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<Turn**,std::vector<Turn*,std::allocator<Turn*>>>,__gnu_cxx::__ops::_Iter_equals_val<Turn_const*const>>
                    ((this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (_Var2._M_current ==
        (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Turn*,std::allocator<Turn*>>::_M_realloc_insert<Turn*const&>
                ((vector<Turn*,std::allocator<Turn*>> *)&this->turns,__position,&local_30);
    }
    else {
      *__position._M_current = turn;
      pppTVar1 = &(this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  return _Var2._M_current == __position._M_current;
}

Assistant:

bool NurseSolution::addTurn(Turn* turn){
    if(!hasTurn(turn))
    {
        turns.push_back(turn);
        return true;
    }
    return false;
}